

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall duckdb::VacuumTask::ExecuteTask(VacuumTask *this)

{
  RowGroupCollection *args;
  pointer puVar1;
  pointer puVar2;
  pointer pRVar3;
  Allocator *allocator;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  type this_00;
  __uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *__u;
  CollectionCheckpointState *pCVar7;
  pointer pCVar8;
  InternalException *this_01;
  ulong uVar9;
  idx_t iVar10;
  CollectionCheckpointState *checkpoint_state;
  RowGroup *pRVar11;
  size_type __n;
  CollectionCheckpointState *pCVar12;
  idx_t target_idx;
  ulong append_count;
  allocator local_401;
  RowGroup *local_400;
  CollectionCheckpointState *local_3f8;
  RowGroup *local_3f0;
  vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
  new_row_groups;
  ulong local_3d0;
  vector<unsigned_long,_true> append_counts;
  idx_t start;
  undefined1 local_398 [32];
  vector<duckdb::StorageIndex,_true> column_ids;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_358;
  DataChunk scan_chunk;
  TableAppendState append_state;
  TableScanState scan_state;
  
  args = ((this->super_BaseCheckpointTask).checkpoint_state)->collection;
  local_3f0 = (RowGroup *)args->row_group_size;
  local_400 = (RowGroup *)&args->types;
  new_row_groups.
  super_vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  new_row_groups.
  super_vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  new_row_groups.
  super_vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  append_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  append_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  append_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pRVar11 = (RowGroup *)this->merge_rows;
  start = this->row_start;
  for (uVar9 = 0; uVar9 < this->target_count; uVar9 = uVar9 + 1) {
    scan_state.table_state.row_group = local_3f0;
    if (pRVar11 < local_3f0) {
      scan_state.table_state.row_group = pRVar11;
    }
    make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,unsigned_long&,unsigned_long&>
              ((duckdb *)&append_state,args,&start,(unsigned_long *)&scan_state);
    pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *
                        )&append_state);
    RowGroup::InitializeEmpty(pRVar3,(vector<duckdb::LogicalType,_true> *)local_400);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>>>
    ::emplace_back<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>>
              ((vector<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowGroup,std::default_delete<duckdb::RowGroup>,true>>>
                *)&new_row_groups,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &append_state);
    scan_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&append_counts,
               (unsigned_long *)&scan_chunk);
    pRVar11 = (RowGroup *)((long)pRVar11 - (long)scan_state.table_state.row_group);
    start = (long)&((scan_state.table_state.row_group)->super_SegmentBase<duckdb::RowGroup>).start +
            start;
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&append_state
              );
  }
  DataChunk::DataChunk(&scan_chunk);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&scan_chunk,allocator,(vector<duckdb::LogicalType,_true> *)local_400,0x800);
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>.
  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (scan_state.table_state.row_group = (RowGroup *)0x0;
      scan_state.table_state.row_group <
      (RowGroup *)
      (((long)(args->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(args->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x18);
      scan_state.table_state.row_group =
           (RowGroup *)
           ((long)&((scan_state.table_state.row_group)->super_SegmentBase<duckdb::RowGroup>).start +
           1)) {
    ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
    emplace_back<unsigned_long&>
              ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&column_ids,
               (unsigned_long *)&scan_state);
  }
  TableAppendState::TableAppendState(&append_state);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
           ::get<true>(&new_row_groups,0);
  pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     (pvVar4);
  RowGroup::InitializeAppend(pRVar3,&append_state.row_group_append_state);
  TableScanState::TableScanState(&scan_state);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            (&local_358,
             &column_ids.super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  TableScanState::Initialize
            (&scan_state,(vector<duckdb::StorageIndex,_true> *)&local_358,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_358);
  CollectionScanState::Initialize
            (&scan_state.table_state,(vector<duckdb::LogicalType,_true> *)local_400);
  scan_state.table_state.max_row = 0xffffffffffffffff;
  checkpoint_state = (CollectionCheckpointState *)this->segment_idx;
  puVar1 = (this->vacuum_state->row_group_counts).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->vacuum_state->row_group_counts).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3d0 = 0;
  __n = 0;
  do {
    if ((this->merge_count <= local_3d0) ||
       ((CollectionCheckpointState *)((long)puVar1 - (long)puVar2 >> 3) <= checkpoint_state)) {
      iVar10 = 0;
      for (pCVar12 = (CollectionCheckpointState *)0x0;
          pCVar7 = (CollectionCheckpointState *)this->target_count, pCVar12 < pCVar7;
          pCVar12 = (CollectionCheckpointState *)((long)&pCVar12->collection + 1)) {
        __u = (__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
              vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
              ::get<true>(&new_row_groups,(size_type)pCVar12);
        unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                  ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)__u)
        ;
        pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::get<true>
                           (((this->super_BaseCheckpointTask).checkpoint_state)->segments,
                            (long)&pCVar12->collection + this->segment_idx);
        ::std::__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::operator=
                  ((__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
                   &pvVar6->node,__u);
        checkpoint_state = pCVar12;
        pvVar5 = vector<unsigned_long,_true>::get<true>(&append_counts,(size_type)pCVar12);
        iVar10 = iVar10 + *pvVar5;
      }
      if (iVar10 == this->merge_rows) {
        for (pCVar12 = (CollectionCheckpointState *)0x0; pCVar12 < pCVar7;
            pCVar12 = (CollectionCheckpointState *)((long)&pCVar12->collection + 1)) {
          RowGroupCollection::GetCheckpointTask
                    ((RowGroupCollection *)local_398,checkpoint_state,
                     (idx_t)(this->super_BaseCheckpointTask).checkpoint_state);
          pCVar8 = unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>
                   ::operator->((unique_ptr<duckdb::CheckpointTask,_std::default_delete<duckdb::CheckpointTask>,_true>
                                 *)local_398);
          (*(pCVar8->super_BaseCheckpointTask).super_BaseExecutorTask.super_Task._vptr_Task[6])
                    (pCVar8);
          if ((BlockManager *)local_398._0_8_ != (BlockManager *)0x0) {
            (**(code **)(*(long *)local_398._0_8_ + 8))();
          }
          pCVar7 = (CollectionCheckpointState *)this->target_count;
        }
        TableScanState::~TableScanState(&scan_state);
        TableAppendState::~TableAppendState(&append_state);
        ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                  (&column_ids.
                    super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
        DataChunk::~DataChunk(&scan_chunk);
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&append_counts);
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
        ::~vector(&new_row_groups.
                   super_vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                 );
        return;
      }
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_398,
                 "Mismatch in row group count vs verify count in RowGroupCollection::Checkpoint",
                 &local_401);
      InternalException::InternalException(this_01,(string *)local_398);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_3f8 = checkpoint_state;
    pvVar5 = vector<unsigned_long,_true>::get<true>
                       (&this->vacuum_state->row_group_counts,(size_type)checkpoint_state);
    if (*pvVar5 != 0) {
      pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::get<true>
                         (((this->super_BaseCheckpointTask).checkpoint_state)->segments,
                          (size_type)local_3f8);
      this_00 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                          (&pvVar6->node);
      RowGroup::InitializeScan(this_00,&scan_state.table_state);
      local_3d0 = local_3d0 + 1;
      local_400 = this_00;
LAB_0054f09f:
      DataChunk::Reset(&scan_chunk);
      RowGroup::ScanCommitted
                (local_400,&scan_state.table_state,&scan_chunk,TABLE_SCAN_LATEST_COMMITTED_ROWS);
      if (scan_chunk.count != 0) {
        DataChunk::Flatten(&scan_chunk);
        iVar10 = scan_chunk.count;
        do {
          uVar9 = __n + 1;
          do {
            if (iVar10 == 0) goto LAB_0054f09f;
            pvVar5 = vector<unsigned_long,_true>::get<true>(&append_counts,__n);
            append_count = (long)local_3f0 - *pvVar5;
            if (iVar10 < (long)local_3f0 - *pvVar5) {
              append_count = iVar10;
            }
            pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                     ::get<true>(&new_row_groups,__n);
            pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                     operator->(pvVar4);
            RowGroup::Append(pRVar3,&append_state.row_group_append_state,&scan_chunk,append_count);
            pvVar5 = vector<unsigned_long,_true>::get<true>(&append_counts,__n);
            *pvVar5 = *pvVar5 + append_count;
            pvVar5 = vector<unsigned_long,_true>::get<true>(&append_counts,__n);
            iVar10 = iVar10 - append_count;
          } while ((iVar10 == 0) &&
                  (((RowGroup *)*pvVar5 != local_3f0 ||
                   ((ulong)((long)new_row_groups.
                                  super_vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)new_row_groups.
                                  super_vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9))));
          pvVar4 = vector<duckdb::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>,_true>
                   ::get<true>(&new_row_groups,uVar9);
          pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                   operator->(pvVar4);
          RowGroup::InitializeAppend(pRVar3,&append_state.row_group_append_state);
          DataChunk::Slice(&scan_chunk,append_count,iVar10);
          __n = uVar9;
        } while( true );
      }
      RowGroup::CommitDrop(local_400);
      pvVar6 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::get<true>
                         (((this->super_BaseCheckpointTask).checkpoint_state)->segments,
                          (size_type)local_3f8);
      ::std::__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::reset
                ((__uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)
                 &pvVar6->node,(pointer)0x0);
    }
    checkpoint_state = (CollectionCheckpointState *)((long)&local_3f8->collection + 1);
  } while( true );
}

Assistant:

void ExecuteTask() override {
		auto &collection = checkpoint_state.collection;
		const idx_t row_group_size = collection.GetRowGroupSize();
		auto &types = collection.GetTypes();
		// create the new set of target row groups (initially empty)
		vector<unique_ptr<RowGroup>> new_row_groups;
		vector<idx_t> append_counts;
		idx_t row_group_rows = merge_rows;
		idx_t start = row_start;
		for (idx_t target_idx = 0; target_idx < target_count; target_idx++) {
			idx_t current_row_group_rows = MinValue<idx_t>(row_group_rows, row_group_size);
			auto new_row_group = make_uniq<RowGroup>(collection, start, current_row_group_rows);
			new_row_group->InitializeEmpty(types);
			new_row_groups.push_back(std::move(new_row_group));
			append_counts.push_back(0);

			row_group_rows -= current_row_group_rows;
			start += current_row_group_rows;
		}

		DataChunk scan_chunk;
		scan_chunk.Initialize(Allocator::DefaultAllocator(), types);

		vector<StorageIndex> column_ids;
		for (idx_t c = 0; c < types.size(); c++) {
			column_ids.emplace_back(c);
		}

		idx_t current_append_idx = 0;

		// fill the new row group with the merged rows
		TableAppendState append_state;
		new_row_groups[current_append_idx]->InitializeAppend(append_state.row_group_append_state);

		TableScanState scan_state;
		scan_state.Initialize(column_ids);
		scan_state.table_state.Initialize(types);
		scan_state.table_state.max_row = idx_t(-1);
		idx_t merged_groups = 0;
		idx_t total_row_groups = vacuum_state.row_group_counts.size();
		for (idx_t c_idx = segment_idx; merged_groups < merge_count && c_idx < total_row_groups; c_idx++) {
			if (vacuum_state.row_group_counts[c_idx] == 0) {
				continue;
			}
			merged_groups++;

			auto &current_row_group = *checkpoint_state.segments[c_idx].node;

			current_row_group.InitializeScan(scan_state.table_state);
			while (true) {
				scan_chunk.Reset();

				current_row_group.ScanCommitted(scan_state.table_state, scan_chunk,
				                                TableScanType::TABLE_SCAN_LATEST_COMMITTED_ROWS);
				if (scan_chunk.size() == 0) {
					break;
				}
				scan_chunk.Flatten();
				idx_t remaining = scan_chunk.size();
				while (remaining > 0) {
					idx_t append_count = MinValue<idx_t>(remaining, row_group_size - append_counts[current_append_idx]);
					new_row_groups[current_append_idx]->Append(append_state.row_group_append_state, scan_chunk,
					                                           append_count);
					append_counts[current_append_idx] += append_count;
					remaining -= append_count;
					const bool row_group_full = append_counts[current_append_idx] == row_group_size;
					const bool last_row_group = current_append_idx + 1 >= new_row_groups.size();
					if (remaining > 0 || (row_group_full && !last_row_group)) {
						// move to the next row group
						current_append_idx++;
						new_row_groups[current_append_idx]->InitializeAppend(append_state.row_group_append_state);
						// slice chunk for the next append
						scan_chunk.Slice(append_count, remaining);
					}
				}
			}
			// drop the row group after merging
			current_row_group.CommitDrop();
			checkpoint_state.segments[c_idx].node.reset();
		}
		idx_t total_append_count = 0;
		for (idx_t target_idx = 0; target_idx < target_count; target_idx++) {
			auto &row_group = new_row_groups[target_idx];
			row_group->Verify();

			// assign the new row group to the current segment
			checkpoint_state.segments[segment_idx + target_idx].node = std::move(row_group);
			total_append_count += append_counts[target_idx];
		}
		if (total_append_count != merge_rows) {
			throw InternalException("Mismatch in row group count vs verify count in RowGroupCollection::Checkpoint");
		}
		// merging is complete - execute checkpoint tasks of the target row groups
		for (idx_t i = 0; i < target_count; i++) {
			auto checkpoint_task = collection.GetCheckpointTask(checkpoint_state, segment_idx + i);
			checkpoint_task->ExecuteTask();
		}
	}